

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void logical_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int local_34;
  int i;
  int *accum_aux_local;
  int *accum_local;
  int *auxs_local;
  int *vals_local;
  int n_local;
  
  *accum = 0x7ffffffe;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    logical_or_combine_accum_help(vals[local_34],accum);
  }
  *accum_aux = 0x7ffffffe;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    logical_or_combine_accum_help(auxs[local_34],accum_aux);
  }
  return;
}

Assistant:

static void logical_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(auxs[i], accum_aux);
	}
}